

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QList<QByteArray>>>::
     call<QtPromise::QPromiseResolve<QList<QByteArray>>,QtPromise::QPromiseReject<QList<QByteArray>>>
               (QPromise<QList<QByteArray>_> *promise,QPromiseResolve<QList<QByteArray>_> *resolve,
               QPromiseReject<QList<QByteArray>_> *reject)

{
  QPromiseReject<QList<QByteArray>> *this;
  QPromiseReject<QList<QByteArray>_> *this_00;
  QPromiseResolve<QList<QByteArray>_> *fulfilled;
  bool bVar1;
  PromiseValue<QList<QByteArray>_> *value;
  PromiseData<QList<QByteArray>_> *pPVar2;
  PromiseError *error;
  QPromiseReject<QList<QByteArray>_> local_70;
  QPromise<QList<QByteArray>_> local_68 [2];
  anon_class_24_2_d74e9aa7 local_48;
  QPromise<void> local_30;
  QPromiseReject<QList<QByteArray>> *local_20;
  QPromiseReject<QList<QByteArray>_> *reject_local;
  QPromiseResolve<QList<QByteArray>_> *resolve_local;
  QPromise<QList<QByteArray>_> *promise_local;
  
  local_20 = (QPromiseReject<QList<QByteArray>> *)reject;
  reject_local = (QPromiseReject<QList<QByteArray>_> *)resolve;
  resolve_local = (QPromiseResolve<QList<QByteArray>_> *)promise;
  bVar1 = QtPromise::QPromiseBase<QList<QByteArray>_>::isFulfilled
                    (&promise->super_QPromiseBase<QList<QByteArray>_>);
  this_00 = reject_local;
  if (bVar1) {
    pPVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<QByteArray>_>_>::
             operator->((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<QByteArray>_>_>
                         *)(resolve_local + 1));
    value = PromiseData<QList<QByteArray>_>::value(pPVar2);
    QtPromise::QPromiseResolve<QList<QByteArray>>::operator()
              ((QPromiseResolve<QList<QByteArray>> *)this_00,value);
  }
  else {
    bVar1 = QtPromise::QPromiseBase<QList<QByteArray>_>::isRejected
                      ((QPromiseBase<QList<QByteArray>_> *)resolve_local);
    fulfilled = resolve_local;
    this = local_20;
    if (bVar1) {
      pPVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<QByteArray>_>_>::
               operator->((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<QByteArray>_>_>
                           *)(resolve_local + 1));
      error = PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>::error
                        (&pPVar2->
                          super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>
                        );
      QtPromise::QPromiseReject<QList<QByteArray>>::operator()(this,error);
    }
    else {
      QtPromise::QPromiseResolve<QList<QByteArray>_>::QPromiseResolve
                ((QPromiseResolve<QList<QByteArray>_> *)&local_48,
                 (QPromiseResolve<QList<QByteArray>_> *)reject_local);
      QtPromise::QPromise<QList<QByteArray>_>::QPromise
                (&local_48.promise,(QPromise<QList<QByteArray>_> *)resolve_local);
      QtPromise::QPromiseReject<QList<QByteArray>_>::QPromiseReject
                (&local_70,(QPromiseReject<QList<QByteArray>_> *)local_20);
      QtPromise::QPromise<QList<QByteArray>_>::QPromise
                (local_68,(QPromise<QList<QByteArray>_> *)resolve_local);
      QtPromise::QPromiseBase<QList<QByteArray>>::
      then<QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QList<QByteArray>>>::call<QtPromise::QPromiseResolve<QList<QByteArray>>,QtPromise::QPromiseReject<QList<QByteArray>>>(QtPromise::QPromise<QList<QByteArray>>const&,QtPromise::QPromiseResolve<QList<QByteArray>>const&,QtPromise::QPromiseReject<QList<QByteArray>>const&)::_lambda()_1_,QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QList<QByteArray>>>::call<QtPromise::QPromiseResolve<QList<QByteArray>>,QtPromise::QPromiseReject<QList<QByteArray>>>(QtPromise::QPromise<QList<QByteArray>>const&,QtPromise::QPromiseResolve<QList<QByteArray>>const&,QtPromise::QPromiseReject<QList<QByteArray>>const&)::_lambda()_2_>
                ((QPromiseBase<QList<QByteArray>> *)&local_30,(anon_class_24_2_e6a34898 *)fulfilled,
                 &local_48);
      QtPromise::QPromise<void>::~QPromise(&local_30);
      call<QtPromise::QPromiseResolve<QList<QByteArray>>,QtPromise::QPromiseReject<QList<QByteArray>>>(QtPromise::QPromise<QList<QByteArray>>const&,QtPromise::QPromiseResolve<QList<QByteArray>>const&,QtPromise::QPromiseReject<QList<QByteArray>>const&)
      ::{lambda()#2}::~call((_lambda___2_ *)&local_70);
      call<QtPromise::QPromiseResolve<QList<QByteArray>>,QtPromise::QPromiseReject<QList<QByteArray>>>(QtPromise::QPromise<QList<QByteArray>>const&,QtPromise::QPromiseResolve<QList<QByteArray>>const&,QtPromise::QPromiseReject<QList<QByteArray>>const&)
      ::{lambda()#1}::~call((_lambda___1_ *)&local_48);
    }
  }
  return;
}

Assistant:

static void
    call(const QtPromise::QPromise<T>& promise, const TResolve& resolve, const TReject& reject)
    {
        if (promise.isFulfilled()) {
            resolve(promise.m_d->value());
        } else if (promise.isRejected()) {
            reject(promise.m_d->error());
        } else {
            promise.then(
                [=]() {
                    resolve(promise.m_d->value());
                },
                [=]() { // catch all
                    reject(promise.m_d->error());
                });
        }
    }